

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureAnalyzer.cpp
# Opt level: O1

vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_> * __thiscall
dg::vr::StructureAnalyzer::possibleSources
          (vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>
           *__return_storage_ptr__,StructureAnalyzer *this,PHINode *phi,bool bval)

{
  pointer *pppVVar1;
  uint uVar2;
  long lVar3;
  iterator __position;
  int iVar4;
  uint uVar5;
  PHINode *pPVar6;
  VRLocation *pVVar7;
  ulong uVar8;
  Instruction *ptr;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  bool bVar12;
  _Head_base<0UL,_dg::vr::VREdge_*,_false> local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar11 = *(uint *)(phi + 0x14);
  uVar9 = (ulong)(uVar11 & 0x7ffffff);
  if ((uVar11 & 0x7ffffff) != 0) {
    lVar10 = 0;
    uVar8 = 0;
    do {
      if ((uVar11 >> 0x1e & 1) == 0) {
        pPVar6 = phi + uVar9 * -0x20;
      }
      else {
        pPVar6 = *(PHINode **)(phi + -8);
      }
      lVar3 = *(long *)(pPVar6 + lVar10);
      if ((lVar3 == 0) || (*(char *)(lVar3 + 0x10) != '\x10')) {
LAB_00127df8:
        if ((uVar11 >> 0x1e & 1) == 0) {
          pPVar6 = phi + uVar9 * -0x20;
        }
        else {
          pPVar6 = *(PHINode **)(phi + -8);
        }
        ptr = (Instruction *)
              (**(long **)(*(long *)(pPVar6 + uVar8 * 8 + (ulong)*(uint *)(phi + 0x3c) * 0x20) +
                          0x28) + -0x18);
        if (**(long **)(*(long *)(pPVar6 + uVar8 * 8 + (ulong)*(uint *)(phi + 0x3c) * 0x20) + 0x28)
            == 0) {
          ptr = (Instruction *)0x0;
        }
        pVVar7 = VRCodeGraph::getVRLocation(*(VRCodeGraph **)(this + 8),ptr);
        local_38._M_head_impl =
             *(VREdge **)
              &(((pVVar7->successors).
                 super__Vector_base<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>,_std::allocator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_t).
               super___uniq_ptr_impl<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>._M_t;
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<dg::vr::VREdge_const*,std::allocator<dg::vr::VREdge_const*>>::
          _M_realloc_insert<dg::vr::VREdge*>
                    ((vector<dg::vr::VREdge_const*,std::allocator<dg::vr::VREdge_const*>> *)
                     __return_storage_ptr__,__position,&local_38._M_head_impl);
        }
        else {
          *__position._M_current = local_38._M_head_impl;
          pppVVar1 = &(__return_storage_ptr__->
                      super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppVVar1 = *pppVVar1 + 1;
        }
      }
      else {
        uVar2 = *(uint *)(lVar3 + 0x20);
        if (uVar2 < 0x41) {
          bVar12 = *(long *)(lVar3 + 0x18) == 1;
        }
        else {
          iVar4 = llvm::APInt::countLeadingZerosSlowCase();
          bVar12 = iVar4 == uVar2 - 1;
        }
        if ((bval & bVar12) != 0) goto LAB_00127df8;
        if (uVar2 < 0x41) {
          bVar12 = *(long *)(lVar3 + 0x18) == 0;
        }
        else {
          uVar5 = llvm::APInt::countLeadingZerosSlowCase();
          bVar12 = uVar5 == uVar2;
        }
        if (bVar12 && !bval) goto LAB_00127df8;
      }
      uVar8 = uVar8 + 1;
      uVar11 = *(uint *)(phi + 0x14);
      uVar9 = (ulong)(uVar11 & 0x7ffffff);
      lVar10 = lVar10 + 0x20;
    } while (uVar8 < uVar9);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const VREdge *>
StructureAnalyzer::possibleSources(const llvm::PHINode *phi, bool bval) const {
    std::vector<const VREdge *> result;
    for (unsigned i = 0; i < phi->getNumIncomingValues(); ++i) {
        const llvm::Value *val = phi->getIncomingValue(i);
        const auto *cVal = llvm::dyn_cast<llvm::ConstantInt>(val);

        if (!cVal || (cVal->isOne() && bval) || (cVal->isZero() && !bval)) {
            const auto *block = phi->getIncomingBlock(i);
            const VRLocation &end = codeGraph.getVRLocation(
                    &*std::prev(std::prev(block->end())));
            assert(end.succsSize() == 1);
            result.emplace_back(end.getSuccEdge(0));
        }
    }
    return result;
}